

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
cs::repl::interpret(repl *this,string *code,
                   deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line)

{
  stack_type<cs::method_base_*,_std::allocator> *this_00;
  context_t *pcVar1;
  method_base **ppmVar2;
  method_base *pmVar3;
  int iVar4;
  method_base *pmVar5;
  domain_type *domain_00;
  method_base **ppmVar6;
  statement_base *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *prVar7;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_00;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_01;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_02;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_03;
  allocator_type local_151;
  string *local_150;
  method_base *m;
  domain_type domain;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_e0 [2];
  undefined4 extraout_var;
  
  pcVar1 = &this->context;
  pmVar5 = translator_type::match
                     (&((((this->context).
                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->translator,line);
  m = pmVar5;
  iVar4 = (*pmVar5->_vptr_method_base[2])(pmVar5);
  switch(iVar4) {
  case 0:
    local_150 = code;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&domain,"Null type of grammar.",(allocator *)local_e0);
    runtime_error::runtime_error(prVar7,(string *)&domain);
    __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 1:
    ppmVar6 = (this->methods).m_current;
    ppmVar2 = (this->methods).m_start;
    local_150 = code;
    iVar4 = (*pmVar5->_vptr_method_base[3])(pmVar5);
    if (ppmVar6 == ppmVar2) {
      if (iVar4 == 0x19) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&domain,"Hanging end statement.",(allocator *)local_e0);
        runtime_error::runtime_error(prVar7,(string *)&domain);
        __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_e0;
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)&domain,__l_01,&local_151);
      (*pmVar5->_vptr_method_base[4])(pmVar5,pcVar1,&domain);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)&domain);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(local_e0);
      pmVar5 = m;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_e0;
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)&domain,__l_02,&local_151);
      iVar4 = (*pmVar5->_vptr_method_base[5])(pmVar5,pcVar1,&domain);
      this_01 = (statement_base *)CONCAT44(extraout_var,iVar4);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)&domain);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(local_e0);
    }
    else {
      if (iVar4 == 0x19) {
        stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
        ::pop_no_return(&(((((pcVar1->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->instance).
                           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->super_runtime_type).storage.m_set);
        domain_00 = domain_manager::get_domain
                              (&(((((pcVar1->
                                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->instance).
                                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->super_runtime_type).storage);
        domain_type::domain_type(&domain,domain_00);
        domain_manager::remove_domain
                  (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage);
        this_00 = &this->methods;
        ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(this_00);
        (*(*ppmVar6)->_vptr_method_base[6])(*ppmVar6,pcVar1,&domain);
        ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(this_00);
        pmVar5 = *ppmVar6;
        stack_type<cs::method_base_*,_std::allocator>::pop(this_00);
        domain_type::~domain_type(&domain);
      }
      else {
        pmVar5 = (method_base *)0x0;
      }
      pmVar3 = m;
      if ((this->methods).m_current != (this->methods).m_start) {
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)local_e0;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&domain,__l_03,&local_151);
        (*pmVar3->_vptr_method_base[4])(pmVar3,pcVar1,&domain);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)&domain);
        std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                  (local_e0);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back(&this->tmp,line);
        break;
      }
      iVar4 = (*m->_vptr_method_base[3])(m);
      if (iVar4 == 0x19) {
        iVar4 = (*m->_vptr_method_base[7])(m,pmVar5,pcVar1,this,line);
        this_01 = (statement_base *)CONCAT44(extraout_var_00,iVar4);
      }
      else {
        iVar4 = (*pmVar5->_vptr_method_base[5])(pmVar5,pcVar1,this);
        this_01 = (statement_base *)CONCAT44(extraout_var_01,iVar4);
      }
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::clear(&this->tmp);
    }
    if (this_01 != (statement_base *)0x0) {
      if (this->echo == true) {
        statement_base::repl_run(this_01);
      }
      else {
        statement_base::run(this_01);
      }
    }
    break;
  case 2:
    stack_type<cs::method_base*,std::allocator>::push<cs::method_base*&>
              ((stack_type<cs::method_base*,std::allocator> *)&this->methods,&m);
    domain_manager::add_domain
              (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
    stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
    ::push<>(&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->super_runtime_type).storage.m_set);
    ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(&this->methods);
    pmVar5 = *ppmVar6;
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
    __l._M_len = 1;
    __l._M_array = (iterator)local_e0;
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)&domain,__l,&local_151);
    (*pmVar5->_vptr_method_base[4])(pmVar5,pcVar1,&domain);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)&domain);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(local_e0);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::push_back(&this->tmp,line);
    break;
  case 3:
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_e0;
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)&domain,__l_00,&local_151);
    (*pmVar5->_vptr_method_base[5])(pmVar5,pcVar1,&domain);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)&domain);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(local_e0);
  }
  compiler_type::utilize_metadata
            ((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  domain_manager::clear_set
            (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->super_runtime_type).storage);
  return;
}

Assistant:

void repl::interpret(const string &code, std::deque<token_base *> &line)
	{
		statement_base *sptr = nullptr;
		try {
			method_base *m = context->compiler->match_method(line);
			switch (m->get_type()) {
			case method_types::null:
				throw runtime_error("Null type of grammar.");
				break;
			case method_types::single: {
				if (!methods.empty()) {
					method_base *expected_method = nullptr;
					if (m->get_target_type() == statement_types::end_) {
						context->instance->storage.remove_set();
						domain_type domain = std::move(context->instance->storage.get_domain());
						context->instance->storage.remove_domain();
						methods.top()->postprocess(context, domain);
						expected_method = methods.top();
						methods.pop();
					}
					if (methods.empty()) {
						if (m->get_target_type() == statement_types::end_)
							sptr = static_cast<method_end *>(m)->translate_end(expected_method, context, tmp,
							        line);
						else
							sptr = expected_method->translate(context, tmp);
						tmp.clear();
					}
					else {
						m->preprocess(context, {line});
						tmp.push_back(line);
					}
				}
				else {
					if (m->get_target_type() == statement_types::end_)
						throw runtime_error("Hanging end statement.");
					else {
						m->preprocess(context, {line});
						sptr = m->translate(context, {line});
					}
				}
			}
			break;
			case method_types::block: {
				methods.push(m);
				context->instance->storage.add_domain();
				context->instance->storage.add_set();
				methods.top()->preprocess(context, {line});
				tmp.push_back(line);
			}
			break;
			case method_types::jit_command:
				m->translate(context, {line});
				break;
			}
			if (sptr != nullptr)
				echo ? sptr->repl_run() : sptr->run();
		}
		catch (const lang_error &le) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw fatal_error(std::string("Uncaught exception: ") + le.what());
		}
		catch (const cs::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw e;
		}
		catch (const std::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw exception(line_num, context->file_path, code, e.what());
		}
		context->compiler->utilize_metadata();
		context->instance->storage.clear_set();
	}